

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O1

Ref __thiscall
wasm::Wasm2JSBuilder::processExpression(wasm::Expression*,wasm::Module*,wasm::Function*,bool)::
ExpressionProcessor::blockify(cashew::Ref_(void *this,Ref ast)

{
  bool bVar1;
  Ref *pRVar2;
  Ref local_20;
  Ref local_18;
  Ref ret;
  
  local_20.inst = (Value *)this;
  bVar1 = cashew::Ref::operator!(&local_20);
  if ((!bVar1) && ((local_20.inst)->type == Array)) {
    pRVar2 = cashew::Ref::operator[](&local_20,0);
    bVar1 = cashew::Ref::operator==(pRVar2,(IString *)&BLOCK);
    if (bVar1) {
      return (Ref)(Value *)this;
    }
  }
  local_18 = cashew::ValueBuilder::makeBlock();
  pRVar2 = cashew::Ref::operator[](&local_18,1);
  cashew::Value::push_back(pRVar2->inst,(Ref)this);
  return (Ref)local_18.inst;
}

Assistant:

Ref blockify(Ref ast) {
      if (isBlock(ast)) {
        return ast;
      }
      Ref ret = ValueBuilder::makeBlock();
      ret[1]->push_back(ValueBuilder::makeStatement(ast));
      return ret;
    }